

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::
RepeatedImmutableMessageFieldGenerator
          (RepeatedImmutableMessageFieldGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  _func_int **in_RSI;
  ImmutableFieldGenerator *in_RDI;
  FieldDescriptor *in_stack_00000008;
  Context *in_stack_00000010;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000910;
  ClassNameResolver *in_stack_00000918;
  FieldGeneratorInfo *in_stack_00000920;
  int in_stack_00000928;
  int in_stack_0000092c;
  FieldDescriptor *in_stack_00000930;
  
  ImmutableFieldGenerator::ImmutableFieldGenerator(in_RDI);
  in_RDI->_vptr_ImmutableFieldGenerator =
       (_func_int **)&PTR__RepeatedImmutableMessageFieldGenerator_008972b8;
  in_RDI[1]._vptr_ImmutableFieldGenerator = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x58f2f0);
  pCVar1 = Context::GetNameResolver((Context *)0x58f308);
  in_RDI[8]._vptr_ImmutableFieldGenerator = (_func_int **)pCVar1;
  Context::GetFieldGeneratorInfo(in_stack_00000010,in_stack_00000008);
  anon_unknown_5::SetMessageVariables
            (in_stack_00000930,in_stack_0000092c,in_stack_00000928,in_stack_00000920,
             in_stack_00000918,in_stack_00000910);
  return;
}

Assistant:

RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor),
                      name_resolver_, &variables_);
}